

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::ImageTargetGLES2::ImageTargetGLES2
          (ImageTargetGLES2 *this,EglTestContext *eglTestCtx,GLenum target)

{
  bool *pbVar1;
  bool *__rhs;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"image_target_gles2_",&local_81);
  pbVar1 = glcts::fixed_sample_locations_values + 1;
  if (target == 0x8d41) {
    pbVar1 = (bool *)0x18f60a3;
  }
  __rhs = (bool *)0x18036c1;
  if (target != 0xde1) {
    __rhs = pbVar1;
  }
  std::operator+(&local_60,&local_40,__rhs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Use EGLImage as GLES2 object",&local_82);
  ImageTestCase::ImageTestCase
            (&this->super_ImageTestCase,eglTestCtx,(ApiType)0x2,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTestCase_01e06bd0;
  this->m_target = target;
  return;
}

Assistant:

ImageTargetGLES2 (EglTestContext& eglTestCtx, GLenum target)
		: ImageTestCase	(eglTestCtx, ApiType::es(2, 0), string("image_target_gles2_") + getTargetName(target), "Use EGLImage as GLES2 object")
		, m_target		(target)
	{
	}